

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# airport.cpp
# Opt level: O2

void __thiscall Airport::push_ticket(Airport *this,Ticket *obj)

{
  pair<const_unsigned_int,_Ticket> pStack_78;
  
  std::pair<const_unsigned_int,_Ticket>::pair<const_unsigned_int,_Ticket,_true>
            (&pStack_78,&obj->id,obj);
  std::
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,Ticket>,std::_Select1st<std::pair<unsigned_int_const,Ticket>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Ticket>>>
  ::_M_insert_unique<std::pair<unsigned_int_const,Ticket>>
            ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,Ticket>,std::_Select1st<std::pair<unsigned_int_const,Ticket>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Ticket>>>
              *)this,&pStack_78);
  Ticket::~Ticket(&pStack_78.second);
  return;
}

Assistant:

void Airport::push_ticket(const Ticket &obj)
{
    tickets.insert({obj.id,obj});
}